

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O0

cell_map * next_generation(cell_map *__return_storage_ptr__,cell_map *cm)

{
  bool bVar1;
  char cVar2;
  reference puVar3;
  byte *pbVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_38;
  uint8_t count;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it_row_end;
  int x;
  int y;
  const_iterator it;
  cell_map *cm_local;
  cell_map *next;
  
  it._M_current._7_1_ = 0;
  cell_map::cell_map(__return_storage_ptr__,cm);
  _x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&cm->cells);
  for (it_row_end._M_current._4_4_ = 0; it_row_end._M_current._4_4_ < cm->height;
      it_row_end._M_current._4_4_ = it_row_end._M_current._4_4_ + 1) {
    it_row_end._M_current._0_4_ = 0;
    _Stack_38 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&x,(long)cm->width);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&x,&stack0xffffffffffffffc8), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&x);
      if (*puVar3 != '\0') {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&x);
        cVar2 = (char)((int)(uint)*pbVar4 >> 1);
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&x);
        if ((*pbVar4 & 1) == 0) {
          if (cVar2 == '\x03') {
            cell_map::set_cell(__return_storage_ptr__,(int)it_row_end._M_current,
                               it_row_end._M_current._4_4_);
          }
        }
        else if ((cVar2 != '\x02') && (cVar2 != '\x03')) {
          cell_map::clear_cell
                    (__return_storage_ptr__,(int)it_row_end._M_current,it_row_end._M_current._4_4_);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&x);
      it_row_end._M_current._0_4_ = (int)it_row_end._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline cell_map next_generation(const cell_map& cm)
  {
  cell_map next(cm);
  auto it = cm.cells.begin();
  for (int y = 0; y < cm.height; ++y)
    {
    int x = 0;
    auto it_row_end = it + cm.width;
    while (it != it_row_end)
      {
      if (*it)
        {
        uint8_t count = *it >> 1;
        if (*it & 1)
          {
          // Cell is on; turn it off if it doesn't have
          // 2 or 3 neighbors
          if ((count != 2) && (count != 3))
            next.clear_cell(x, y);
          }
        else
          {
          // Cell is off; turn it on if it has exactly 3 neighbors
          if (count == 3)
            next.set_cell(x, y);
          }
        }
      ++it;
      ++x;
      }
    }
  return next;
  }